

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O2

void Cnf_CutRef(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  Aig_Obj_t *pAVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (pCut->nFanins <= lVar2) {
      return;
    }
    pAVar1 = Aig_ManObj(p->pManAig,*(int *)((long)pCut[1].vIsop + lVar2 * 4 + -8));
    if (pAVar1 == (Aig_Obj_t *)0x0) break;
    *(ulong *)&pAVar1->field_0x18 =
         *(ulong *)&pAVar1->field_0x18 & 0xffffffff0000003f |
         (ulong)((int)*(ulong *)&pAVar1->field_0x18 + 0x40U & 0xffffffc0);
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void Cnf_CutRef( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        pObj->nRefs++;
    }
}